

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Array.h
# Opt level: O2

Array<int> * __thiscall asl::Array<int>::operator=(Array<int> *this,Array<int> *b)

{
  int *piVar1;
  
  if (this->_a != b->_a) {
    LOCK();
    piVar1 = this->_a + -2;
    *piVar1 = *piVar1 + -1;
    UNLOCK();
    if (*piVar1 == 0) {
      free(this,b);
    }
    piVar1 = b->_a;
    this->_a = piVar1;
    LOCK();
    piVar1 = piVar1 + -2;
    *piVar1 = *piVar1 + 1;
    UNLOCK();
  }
  return this;
}

Assistant:

Array& operator=(const Array& b)
	{
		if (_a == b._a)
			return *this;
		if(--d().rc==0) free();
		_a = b._a;
		++d().rc;
		return *this;
	}